

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O0

pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *
genPlanePair<double>
          (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
           *__return_storage_ptr__,Matrix<double,_4,_4,_0,_4,_4> *T)

{
  non_const_type local_238;
  XprTypeNested local_230;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
  local_228;
  undefined1 local_218 [8];
  Matrix<double,_4,_1,_0,_4,_1> Nu;
  Type local_1f0;
  RealScalar local_1b8;
  kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> local_1b0;
  undefined1 local_198 [8];
  Matrix<double,_4,_1,_0,_4,_1> Pi;
  int local_140;
  RandomReturnType local_13b;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_138;
  ConstantReturnType local_108;
  undefined1 local_f8 [8];
  FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> lu;
  Matrix<double,_3,_4,_0,_3,_4> nullMatrix;
  Matrix<double,_4,_4,_0,_4,_4> *T_local;
  
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)&lu.m_det_pq);
  Eigen::FullPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::FullPivLU
            ((FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_f8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::Ones(&local_108,3,4);
  Eigen::Matrix<double,3,4,0,3,4>::operator=
            ((Matrix<double,3,4,0,3,4> *)&lu.m_det_pq,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
              *)&local_108);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Random(&local_13b,3,3);
  local_140 = 0x28;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*(&local_138,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
               *)&local_13b,&local_140);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::topLeftCorner<int,int>
            ((Type *)(Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array + 3),(DenseBase<Eigen::Matrix<double,3,4,0,3,4>> *)&lu.m_det_pq,3
             ,3);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,3,4,0,3,4>,_1,_1,false> *)
             (Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
             + 3),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                   *)&local_138);
  Eigen::FullPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::compute<Eigen::Matrix<double,3,4,0,3,4>>
            ((FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_f8,
             (EigenBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&lu.m_det_pq);
  Eigen::FullPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::kernel
            (&local_1b0,(FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_f8);
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::ReturnByValue<Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>>
            ((Matrix<double,4,1,0,4,1> *)local_198,
             (EigenBase<Eigen::ReturnByValue<Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
              *)&local_1b0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_1f0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_198,3);
  local_1b8 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                   &local_1f0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_198,&local_1b8);
  local_238 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)T);
  local_230.m_matrix =
       (non_const_type)
       Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>::inverse
                 ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)&local_238
                 );
  local_228 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>::
              operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>>
                         *)&local_230,(MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_198
                       );
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
            ((Matrix<double,4,1,0,4,1> *)local_218,
             (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
              *)&local_228);
  std::make_pair<Eigen::Matrix<double,4,1,0,4,1>&,Eigen::Matrix<double,4,1,0,4,1>&>
            (__return_storage_ptr__,(Matrix<double,_4,_1,_0,_4,_1> *)local_198,
             (Matrix<double,_4,_1,_0,_4,_1> *)local_218);
  Eigen::FullPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~FullPivLU
            ((FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> 
    genPlanePair(Eigen::Matrix<floatPrec,4,4> T){
    
    Eigen::Matrix<floatPrec, 3, 4> nullMatrix;
    Eigen::FullPivLU<Eigen::Matrix<floatPrec, Eigen::Dynamic, Eigen::Dynamic>> lu;

    // the null space of the matrix built from threee
    // randomly generated 3D points in homogenous coordinates
    nullMatrix = Eigen::Matrix<floatPrec, 3, 4>::Ones(3, 4);
    
    nullMatrix.topLeftCorner(3, 3) =
        Eigen::Matrix<floatPrec, 3, 3>::Random(3, 3) * int(POINTSWITHINCUBE);

    lu.compute(nullMatrix);
    Eigen::Matrix<floatPrec, 4,1> Pi = lu.kernel();
    Pi /= Pi.head(3).norm();

    // requires the pose from the two scans, to compute
    // the coordinates of the plane in RefB
    Eigen::Matrix<floatPrec, 4,1> Nu = T.transpose().inverse() * Pi;

    return std::make_pair(Pi,Nu);
}